

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O2

void duckdb::roaring::AppendToArray<true>
               (ContainerCompressionState *state,bool null,uint16_t amount)

{
  uint uVar1;
  ushort uVar2;
  ushort uVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint16_t *puVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,null) != 0) {
    uVar2 = state->array_idx[1];
    uVar11 = (uint)uVar2 + (uint)amount;
    if (uVar11 < 0xf9) {
      uVar3 = state->appended_count;
      puVar4 = state->compressed_arrays[1];
      puVar5 = state->array_counts[1];
      for (uVar10 = 0; (ushort)uVar10 < amount; uVar10 = uVar10 + (uVar8 & 0xff)) {
        uVar1 = (uVar10 & 0xffff) + (uint)uVar3;
        uVar7 = uVar1 & 0xff;
        if ((ushort)uVar10 != 0) {
          uVar7 = 0;
        }
        uVar8 = 0x100 - uVar7;
        if ((ushort)(amount - uVar10) < (ushort)(0x100 - uVar7)) {
          uVar8 = amount - uVar10;
        }
        for (uVar9 = 0; (uVar8 & 0xff) != uVar9; uVar9 = uVar9 + 1) {
          puVar4[uVar9 + ((uVar10 & 0xffff) + (uint)uVar2)] = (char)uVar9 + (char)uVar7;
        }
        puVar5[uVar1 >> 8] = puVar5[uVar1 >> 8] + (char)uVar8;
      }
      if (uVar11 < 8) {
        puVar6 = state->arrays[1];
        for (uVar9 = 0; (uint)amount != uVar9; uVar9 = uVar9 + 1) {
          *(ushort *)((long)puVar6 + uVar9 * 2 + (ulong)((uint)uVar2 * 2)) = uVar3 + (short)uVar9;
        }
      }
      state->array_idx[1] = state->array_idx[1] + amount;
      return;
    }
  }
  return;
}

Assistant:

inline void AppendToArray(ContainerCompressionState &state, bool null, uint16_t amount) {
	if (DUCKDB_LIKELY(INVERTED != null)) {
		return;
	}

	auto current_array_idx = state.array_idx[null];
	if (current_array_idx + amount > MAX_ARRAY_IDX) {
		return;
	}
	auto appended_count = state.appended_count;
	auto array_count = state.array_counts[null];
	auto compressed_array = state.compressed_arrays[null];
	uint16_t appended = 0;
	while (appended < amount) {
		uint16_t remaining = amount - appended;
		uint8_t segment_offset = appended ? 0 : (appended_count + appended) & (COMPRESSED_SEGMENT_SIZE - 1);
		uint8_t to_append =
		    static_cast<uint8_t>(MinValue<uint16_t>(remaining, COMPRESSED_SEGMENT_SIZE - segment_offset));
		for (uint8_t i = 0; i < to_append; i++) {
			auto index = current_array_idx + appended + i;
			compressed_array[index] = segment_offset + i;
		}

		idx_t segment_index = (appended_count + appended) / COMPRESSED_SEGMENT_SIZE;
		array_count[segment_index] += to_append;
		appended += to_append;
	}

	if (current_array_idx + amount < COMPRESSED_ARRAY_THRESHOLD) {
		auto &array = state.arrays[null];
		for (uint16_t i = 0; i < amount; i++) {
			array[current_array_idx + i] = appended_count + i;
		}
	}
	state.array_idx[null] += amount;
}